

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O0

char ** apprun_string_list_dup(char **list)

{
  uint size_00;
  char **copy;
  uint size;
  char **list_local;
  
  if (list == (char **)0x0) {
    list_local = (char **)0x0;
  }
  else {
    size_00 = apprun_array_len(list);
    list_local = apprun_string_list_alloc(size_00);
    apprun_string_list_copy(list,list_local);
  }
  return list_local;
}

Assistant:

char **apprun_string_list_dup(char *const *list) {
    if (list != NULL) {
        unsigned size = apprun_array_len(list);
        char **copy = apprun_string_list_alloc(size);

        apprun_string_list_copy(list, copy);

        return copy;
    } else
        return NULL;
}